

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

bool __thiscall QWidgetWindowPrivate::participatesInLastWindowClosed(QWidgetWindowPrivate *this)

{
  bool bVar1;
  byte bVar2;
  QWidgetWindow *this_00;
  QWidgetWindowPrivate *in_RDI;
  QWidgetWindow *q;
  WidgetAttribute attribute;
  undefined1 local_1;
  
  this_00 = q_func(in_RDI);
  attribute = (WidgetAttribute)((ulong)in_RDI >> 0x20);
  QWidgetWindow::widget((QWidgetWindow *)0x3b7f2b);
  bVar1 = QWidget::testAttribute((QWidget *)this_00,attribute);
  if (bVar1) {
    bVar2 = QWindowPrivate::participatesInLastWindowClosed();
    local_1 = (bool)(bVar2 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QWidgetWindowPrivate::participatesInLastWindowClosed() const
{
    Q_Q(const QWidgetWindow);

    // For historical reasons WA_QuitOnClose has been closely tied
    // to the lastWindowClosed signal, since the default behavior
    // is to quit the application after emitting lastWindowClosed.
    // ### Qt 7: Rename this attribute, or decouple behavior.
    if (!q->widget()->testAttribute(Qt::WA_QuitOnClose))
        return false;

    return QWindowPrivate::participatesInLastWindowClosed();
}